

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicy.cpp
# Opt level: O2

void __thiscall
pgi::JointPolicy::JointPolicy
          (JointPolicy *this,
          vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
          *locals)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint uVar3;
  vector<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *comb;
  uint n;
  unsigned_long uVar4;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  v;
  const_iterator __begin2;
  const_iterator __end2;
  undefined1 local_f8 [32];
  combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_d8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_c8;
  const_iterator local_b0;
  const_iterator local_88;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  pgi local_48 [24];
  
  boost::bimaps::
  bimap<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>
  ::bimap(&this->vm,(allocator_type *)&local_b0);
  p_Var1 = &(this->stepmap)._M_t._M_impl.super__Rb_tree_header;
  (this->stepmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->stepmap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->stepmap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->stepmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stepmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stepmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  ::vector(&this->locals_,locals);
  uVar4 = 0;
  n = 0;
  while( true ) {
    uVar3 = find_max_steps(locals);
    if (uVar3 < n) break;
    vertices_with_n_steps(&local_c8,n,locals);
    local_d8.first_._M_current =
         local_c8.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_d8.last_._M_current =
         local_c8.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::cbegin(&local_b0,&local_d8);
    combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::cend(&local_88,&local_d8);
    while( true ) {
      bVar2 = combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              ::const_iterator::operator!=(&local_b0,&local_88);
      if (!bVar2) break;
      std::
      vector<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::vector((vector<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)local_48,&local_b0.combination_);
      get_combination<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,local_48,comb);
      local_f8._0_8_ = uVar4;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_f8 + 8),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
      boost::multi_index::
      multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
      ::insert_<boost::multi_index::detail::lvalue_tag>
                ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                  *)(*(ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_long,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_long>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                       **)((long)&(this->vm).super_relation_set.super_set_adaptor<_a9378c49_>.
                                  super_ordered_associative_container_adaptor<_4bc0be94_>.super_type
                                  .super_type.dwfb + 8) + -8),
                 (pair<const_unsigned_long,_unsigned_int> *)local_f8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_f8 + 8));
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
      local_f8._0_8_ = uVar4;
      local_f8._8_4_ = n;
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_const,unsigned_int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
      ::_M_insert_unique<std::pair<unsigned_long_const,unsigned_int>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_const,unsigned_int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
                  *)&this->stepmap,(pair<const_unsigned_long,_unsigned_int> *)local_f8);
      uVar4 = uVar4 + 1;
      std::
      _Vector_base<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~_Vector_base((_Vector_base<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)local_48);
      combinations<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::const_iterator::operator++(&local_b0);
    }
    std::
    _Vector_base<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::~_Vector_base(&local_88.combination_.
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   );
    std::
    _Vector_base<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::~_Vector_base(&local_b0.combination_.
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   );
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_c8);
    n = n + 1;
  }
  return;
}

Assistant:

JointPolicy::JointPolicy(const std::vector<PolicyGraph>& locals)
    : vm(), stepmap(), locals_(locals) {
  joint_vertex_t current_joint_vertex = 0;

  for (unsigned int steps = 0; steps <= find_max_steps(locals); ++steps) {
    auto v = vertices_with_n_steps(steps, locals);
    for (const auto& qc : make_combinations(v)) {
      vm.insert(vm_type::value_type(current_joint_vertex, get_combination(qc)));
      stepmap.insert(nm_type::value_type(current_joint_vertex, steps));
      ++current_joint_vertex;
    }
  }
}